

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::Add
          (EncodedDescriptorDatabase *this,void *encoded_file_descriptor,int size)

{
  bool bVar1;
  LogMessage *other;
  pair<const_void_*,_int> pVar2;
  pair<const_void_*,_int> value;
  LogFinisher local_171;
  LogMessage local_170;
  undefined4 local_134;
  void *local_130;
  int local_128;
  void *local_120;
  int local_118;
  undefined1 local_100 [8];
  FileDescriptorProto file;
  void *pvStack_20;
  int size_local;
  void *encoded_file_descriptor_local;
  EncodedDescriptorDatabase *this_local;
  
  file.source_code_info_._4_4_ = size;
  pvStack_20 = encoded_file_descriptor;
  encoded_file_descriptor_local = this;
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_100);
  bVar1 = MessageLite::ParseFromArray
                    ((MessageLite *)local_100,pvStack_20,file.source_code_info_._4_4_);
  if (bVar1) {
    pVar2 = std::make_pair<void_const*&,int&>
                      (&stack0xffffffffffffffe0,(int *)((long)&file.source_code_info_ + 4));
    local_130 = pVar2.first;
    local_128 = pVar2.second;
    value._12_4_ = 0;
    value.first = (void *)SUB128(pVar2._0_12_,0);
    value.second = SUB124(pVar2._0_12_,8);
    local_120 = local_130;
    local_118 = local_128;
    this_local._7_1_ =
         SimpleDescriptorDatabase::DescriptorIndex<std::pair<const_void_*,_int>_>::AddFile
                   (&this->index_,(FileDescriptorProto *)local_100,value);
  }
  else {
    internal::LogMessage::LogMessage
              (&local_170,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
               ,0x13d);
    other = internal::LogMessage::operator<<
                      (&local_170,
                       "Invalid file descriptor data passed to EncodedDescriptorDatabase::Add().");
    internal::LogFinisher::operator=(&local_171,other);
    internal::LogMessage::~LogMessage(&local_170);
    this_local._7_1_ = false;
  }
  local_134 = 1;
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_100);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool EncodedDescriptorDatabase::Add(
    const void* encoded_file_descriptor, int size) {
  FileDescriptorProto file;
  if (file.ParseFromArray(encoded_file_descriptor, size)) {
    return index_.AddFile(file, std::make_pair(encoded_file_descriptor, size));
  } else {
    GOOGLE_LOG(ERROR) << "Invalid file descriptor data passed to "
                  "EncodedDescriptorDatabase::Add().";
    return false;
  }
}